

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

TypeReferenceExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::TypeReferenceExpression,slang::ast::Type_const&,slang::ast::Type_const&,slang::SourceRange>
          (BumpAllocator *this,Type *args,Type *args_1,SourceRange *args_2)

{
  SourceRange sourceRange;
  TypeReferenceExpression *pTVar1;
  Type *in_RCX;
  Type *in_RDX;
  TypeReferenceExpression *in_RSI;
  SourceLocation in_RDI;
  SourceLocation unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pTVar1 = (TypeReferenceExpression *)
           allocate((BumpAllocator *)in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  sourceRange.endLoc = unaff_retaddr;
  sourceRange.startLoc = in_RDI;
  ast::TypeReferenceExpression::TypeReferenceExpression(in_RSI,in_RDX,in_RCX,sourceRange);
  return pTVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }